

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int stdin2file(int handle)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  char recbuf [1000];
  undefined4 local_418;
  undefined2 local_414;
  undefined1 local_412 [1002];
  
  iVar2 = fgetc(_stdin);
  if (iVar2 != -1) {
    iVar4 = 0;
    uVar5 = 0;
    do {
      iVar1 = 0;
      if ((iVar2 == "first keyword not SIMPLE"[(long)iVar4 + 0x12]) &&
         (iVar1 = iVar4 + 1, iVar4 + 1 == 6)) {
        local_414 = 0x454c;
        local_418 = 0x504d4953;
        goto LAB_001326ca;
      }
      iVar4 = iVar1;
      iVar2 = fgetc(_stdin);
    } while ((iVar2 != -1) && (bVar6 = uVar5 < 1999, uVar5 = uVar5 + 1, bVar6));
    if (iVar4 == 6) {
LAB_001326ca:
      sVar3 = fread(local_412,1,0x3e2,_stdin);
      iVar2 = file_write(handle,&local_418,sVar3 + 6);
      while( true ) {
        if (iVar2 != 0) {
          return iVar2;
        }
        sVar3 = fread(&local_418,1,1000,_stdin);
        if (sVar3 == 0) break;
        iVar2 = file_write(handle,&local_418,sVar3);
      }
      return 0;
    }
  }
  ffpmsg("Couldn\'t find the string \'SIMPLE\' in the stdin stream");
  return 0x68;
}

Assistant:

int stdin2file(int handle)  /* handle number */
/*
  Copy the stdin stream to a file.  .
*/
{
    size_t nread;
    char simple[] = "SIMPLE";
    int c, ii, jj, status;
    char recbuf[RECBUFLEN];

    ii = 0;
    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(recbuf, simple, 6);  /* copy "SIMPLE" to buffer */
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (ii != 6)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the buffer */
    nread = fread(recbuf + 6, 1, RECBUFLEN - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    status = file_write(handle, recbuf, nread);
    if (status)
       return(status);

    /* copy the rest of stdin stream */
    while(0 != (nread = fread(recbuf,1,RECBUFLEN, stdin)))
    {
        status = file_write(handle, recbuf, nread);
        if (status)
           return(status);
    }

    return(status);
}